

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixRead(sqlite3_file *id,void *pBuf,int amt,sqlite3_int64 offset)

{
  sqlite3_io_methods *psVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int *piVar5;
  uint uVar6;
  void *pvVar7;
  size_t __n;
  uint local_40;
  int local_3c;
  void *local_38;
  
  psVar1 = id[10].pMethods;
  local_40 = amt;
  local_38 = pBuf;
  if ((long)psVar1 - offset != 0 && offset <= (long)psVar1) {
    if (amt + offset <= (long)psVar1) {
      memcpy(pBuf,(void *)((long)&(id[0xd].pMethods)->iVersion + offset),(long)amt);
      return 0;
    }
    iVar2 = (int)((long)psVar1 - offset);
    __n = (size_t)iVar2;
    memcpy(pBuf,(void *)((long)&(id[0xd].pMethods)->iVersion + offset),__n);
    local_38 = (void *)((long)pBuf + __n);
    local_40 = amt - iVar2;
    offset = offset + __n;
  }
  local_3c = 0;
  lVar4 = lseek64(*(int *)&id[3].pMethods,offset,0);
  uVar6 = local_40;
  pvVar7 = local_38;
  while( true ) {
    if (lVar4 < 0) {
      piVar5 = __errno_location();
      *(int *)&id[4].pMethods = *piVar5;
      iVar2 = 0x10a;
      if (local_40 == 0xffffffff) {
        iVar2 = 0;
      }
      return iVar2;
    }
    uVar3 = (*aSyscall[8].pCurrent)((ulong)*(uint *)&id[3].pMethods,pvVar7,(long)(int)uVar6);
    if (uVar6 - uVar3 == 0) break;
    if ((int)uVar3 < 0) {
      piVar5 = __errno_location();
      if (*piVar5 != 4) {
        *(int *)&id[4].pMethods = *piVar5;
        local_3c = 0;
        uVar6 = uVar3;
        break;
      }
    }
    else {
      if (uVar3 == 0) {
        uVar6 = 0;
        break;
      }
      offset = offset + (ulong)(uVar3 & 0x7fffffff);
      local_3c = local_3c + uVar3;
      pvVar7 = (void *)((long)pvVar7 + (ulong)(uVar3 & 0x7fffffff));
      uVar6 = uVar6 - uVar3;
    }
    lVar4 = lseek64(*(int *)&id[3].pMethods,offset,0);
  }
  uVar6 = uVar6 + local_3c;
  if (local_40 - uVar6 == 0) {
    return 0;
  }
  if (-1 < (int)uVar6) {
    *(undefined4 *)&id[4].pMethods = 0;
    memset((void *)((long)local_38 + (ulong)uVar6),0,(long)(int)(local_40 - uVar6));
    return 0x20a;
  }
  return 0x10a;
}

Assistant:

static int unixRead(
  sqlite3_file *id, 
  void *pBuf, 
  int amt,
  sqlite3_int64 offset
){
  unixFile *pFile = (unixFile *)id;
  int got;
  assert( id );
  assert( offset>=0 );
  assert( amt>0 );

  /* If this is a database file (not a journal, master-journal or temp
  ** file), the bytes in the locking range should never be read or written. */
#if 0
  assert( pFile->pUnused==0
       || offset>=PENDING_BYTE+512
       || offset+amt<=PENDING_BYTE 
  );
#endif

#if SQLITE_MAX_MMAP_SIZE>0
  /* Deal with as much of this read request as possible by transfering
  ** data from the memory mapping using memcpy().  */
  if( offset<pFile->mmapSize ){
    if( offset+amt <= pFile->mmapSize ){
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], amt);
      return SQLITE_OK;
    }else{
      int nCopy = pFile->mmapSize - offset;
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], nCopy);
      pBuf = &((u8 *)pBuf)[nCopy];
      amt -= nCopy;
      offset += nCopy;
    }
  }
#endif

  got = seekAndRead(pFile, offset, pBuf, amt);
  if( got==amt ){
    return SQLITE_OK;
  }else if( got<0 ){
    /* lastErrno set by seekAndRead */
    return SQLITE_IOERR_READ;
  }else{
    storeLastErrno(pFile, 0);   /* not a system error */
    /* Unread parts of the buffer must be zero-filled */
    memset(&((char*)pBuf)[got], 0, amt-got);
    return SQLITE_IOERR_SHORT_READ;
  }
}